

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward.hpp
# Opt level: O0

void __thiscall
backward::TraceResolverLinuxBase::TraceResolverLinuxBase(TraceResolverLinuxBase *this)

{
  undefined8 *in_RDI;
  string *in_stack_00000018;
  allocator local_39;
  string local_38 [56];
  
  TraceResolverImplBase::TraceResolverImplBase((TraceResolverImplBase *)0x11f218);
  *in_RDI = &PTR__TraceResolverLinuxBase_0012ec70;
  get_argv0_abi_cxx11_();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"/proc/self/exe",&local_39);
  read_symlink(in_stack_00000018);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

TraceResolverLinuxBase()
      : argv0_(get_argv0()), exec_path_(read_symlink("/proc/self/exe")) {}